

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

shared_ptr<create::Packet> __thiscall create::Data::getPacket(Data *this,uint8_t id)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined7 in_register_00000031;
  map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
  *this_00;
  _Base_ptr p_Var5;
  bool bVar6;
  shared_ptr<create::Packet> sVar7;
  undefined1 local_9;
  
  this_00 = (map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             *)CONCAT71(in_register_00000031,id);
  local_9 = SUB81(in_RDX._M_pi,0);
  p_Var1 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = (byte)(char)p_Var5[1]._M_color < (byte)local_9;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, (byte)local_9 < (byte)(char)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    *(undefined8 *)&(this->packets)._M_t._M_impl = 0;
    *(undefined8 *)&(this->packets)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    pmVar3 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](this_00,&local_9);
    *(element_type **)&(this->packets)._M_t._M_impl =
         (pmVar3->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (pmVar3->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     &(this->packets)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
    in_RDX._M_pi = extraout_RDX;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  sVar7.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar7.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<create::Packet>)
         sVar7.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Packet> Data::getPacket(uint8_t id) {
    if (isValidPacketID(id)) {
      return packets[id];
    }
    return std::shared_ptr<Packet>();
  }